

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::updateMaxCase
          (string *__return_storage_ptr__,CppGenerator *this,size_t depth,string *rel_name,
          string *attr_name,bool parallel)

{
  size_t off;
  size_t off_00;
  CppGenerator *this_00;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  offset_abi_cxx11_(&local_50,this,depth + 3);
  std::operator+(&local_650,&local_50,"case ");
  std::operator+(&local_630,&local_650,rel_name);
  std::operator+(&local_610,&local_630,"_ID:\n");
  off = depth + 4;
  offset_abi_cxx11_(&local_670,this,off);
  std::operator+(&local_5f0,&local_610,&local_670);
  std::operator+(&local_5d0,&local_5f0,"lowerptr_");
  std::operator+(&local_5b0,&local_5d0,rel_name);
  std::operator+(&local_590,&local_5b0,"[");
  std::__cxx11::to_string(&local_690,depth);
  std::operator+(&local_570,&local_590,&local_690);
  std::operator+(&local_550,&local_570,"] += 1;\n");
  offset_abi_cxx11_(&local_6b0,this,off);
  std::operator+(&local_530,&local_550,&local_6b0);
  std::operator+(&local_510,&local_530,"if(lowerptr_");
  std::operator+(&local_4f0,&local_510,rel_name);
  std::operator+(&local_4d0,&local_4f0,"[");
  std::__cxx11::to_string(&local_6d0,depth);
  std::operator+(&local_4b0,&local_4d0,&local_6d0);
  std::operator+(&local_490,&local_4b0,"] > ");
  this_00 = (CppGenerator *)rel_name;
  std::__cxx11::string::string((string *)&local_710,(string *)rel_name);
  getUpperPointer(&local_6f0,this_00,&local_710,depth,parallel);
  std::operator+(&local_470,&local_490,&local_6f0);
  std::operator+(&local_450,&local_470,")\n");
  off_00 = depth + 5;
  offset_abi_cxx11_(&local_730,this,off_00);
  std::operator+(&local_430,&local_450,&local_730);
  std::operator+(&local_410,&local_430,"atEnd[");
  std::__cxx11::to_string(&local_750,depth);
  std::operator+(&local_3f0,&local_410,&local_750);
  std::operator+(&local_3d0,&local_3f0,"] = true;\n");
  offset_abi_cxx11_(&local_770,this,off);
  std::operator+(&local_3b0,&local_3d0,&local_770);
  std::operator+(&local_390,&local_3b0,"else\n");
  offset_abi_cxx11_(&local_790,this,off);
  std::operator+(&local_370,&local_390,&local_790);
  std::operator+(&local_350,&local_370,"{\n");
  offset_abi_cxx11_(&local_7b0,this,off_00);
  std::operator+(&local_330,&local_350,&local_7b0);
  std::operator+(&local_310,&local_330,"max_");
  std::operator+(&local_2f0,&local_310,attr_name);
  std::operator+(&local_2d0,&local_2f0," = ");
  std::operator+(&local_2b0,&local_2d0,rel_name);
  std::operator+(&local_290,&local_2b0,"[lowerptr_");
  std::operator+(&local_270,&local_290,rel_name);
  std::operator+(&local_250,&local_270,"[");
  std::__cxx11::to_string(&local_7d0,depth);
  std::operator+(&local_230,&local_250,&local_7d0);
  std::operator+(&local_210,&local_230,"]].");
  std::operator+(&local_1f0,&local_210,attr_name);
  std::operator+(&local_1d0,&local_1f0,";\n");
  offset_abi_cxx11_(&local_7f0,this,off_00);
  std::operator+(&local_1b0,&local_1d0,&local_7f0);
  std::operator+(&local_190,&local_1b0,"rel[");
  std::__cxx11::to_string(&local_810,depth);
  std::operator+(&local_170,&local_190,&local_810);
  std::operator+(&local_150,&local_170,"] = (rel[");
  std::__cxx11::to_string(&local_830,depth);
  std::operator+(&local_130,&local_150,&local_830);
  std::operator+(&local_110,&local_130,"]+ 1) % numOfRel[");
  std::__cxx11::to_string(&local_850,depth);
  std::operator+(&local_f0,&local_110,&local_850);
  std::operator+(&local_d0,&local_f0,"];\n");
  offset_abi_cxx11_(&local_870,this,off);
  std::operator+(&local_b0,&local_d0,&local_870);
  std::operator+(&local_90,&local_b0,"}\n");
  offset_abi_cxx11_(&local_890,this,off);
  std::operator+(&local_70,&local_90,&local_890);
  std::operator+(__return_storage_ptr__,&local_70,"break;\n");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_830);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::updateMaxCase(size_t depth, const std::string& rel_name,
                                        const std::string& attr_name,
                                        bool parallel)
{
    return offset(3+depth)+"case "+rel_name+"_ID:\n"+
        // update pointer
        offset(4+depth)+"lowerptr_"+rel_name+"["+
        std::to_string(depth)+"] += 1;\n"+
        // if statement
        offset(4+depth)+"if(lowerptr_"+rel_name+"["+
        std::to_string(depth)+"] > "+getUpperPointer(rel_name,depth,parallel)+")\n"+
        // body
        offset(5+depth)+"atEnd["+std::to_string(depth)+"] = true;\n"+
        //else
        offset(4+depth)+"else\n"+offset(4+depth)+"{\n"+
        offset(5+depth)+"max_"+attr_name+" = "+rel_name+"[lowerptr_"+
        rel_name+"["+std::to_string(depth)+"]]."+attr_name+";\n"+
        offset(5+depth)+"rel["+std::to_string(depth)+"] = (rel["+
        std::to_string(depth)+"]+ 1) % numOfRel["+std::to_string(depth)+"];\n"+
        offset(4+depth)+"}\n"+offset(4+depth)+"break;\n";
}